

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoad
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,SIMDLoad *curr)

{
  SIMDLoadOp SVar1;
  
  SVar1 = curr->op;
  if (SVar1 < (Load32x2SVec128|Load8x8SVec128)) {
    if ((0x3f0U >> (SVar1 & 0x1f) & 1) == 0) {
      if ((0xfU >> (SVar1 & 0x1f) & 1) == 0) {
        visitSIMDLoadZero(__return_storage_ptr__,this,curr);
      }
      else {
        visitSIMDLoadSplat(__return_storage_ptr__,this,curr);
      }
    }
    else {
      visitSIMDLoadExtend(__return_storage_ptr__,this,curr);
    }
    return __return_storage_ptr__;
  }
  ::wasm::handle_unreachable
            ("invalid op",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
             ,0xed6);
}

Assistant:

Flow visitSIMDLoad(SIMDLoad* curr) {
    NOTE_ENTER("SIMDLoad");
    switch (curr->op) {
      case Load8SplatVec128:
      case Load16SplatVec128:
      case Load32SplatVec128:
      case Load64SplatVec128:
        return visitSIMDLoadSplat(curr);
      case Load8x8SVec128:
      case Load8x8UVec128:
      case Load16x4SVec128:
      case Load16x4UVec128:
      case Load32x2SVec128:
      case Load32x2UVec128:
        return visitSIMDLoadExtend(curr);
      case Load32ZeroVec128:
      case Load64ZeroVec128:
        return visitSIMDLoadZero(curr);
    }
    WASM_UNREACHABLE("invalid op");
  }